

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread_POSIX.c
# Opt level: O0

UINT8 OSThread_Init(OS_THREAD **retThread,OS_THR_FUNC threadFunc,void *args)

{
  int iVar1;
  OS_THREAD *__newthread;
  int retVal;
  OS_THREAD *thr;
  void *args_local;
  OS_THR_FUNC threadFunc_local;
  OS_THREAD **retThread_local;
  
  __newthread = (OS_THREAD *)calloc(1,0x18);
  if (__newthread == (OS_THREAD *)0x0) {
    retThread_local._7_1_ = 0xff;
  }
  else {
    __newthread->func = threadFunc;
    __newthread->args = args;
    iVar1 = pthread_create((pthread_t *)__newthread,(pthread_attr_t *)0x0,OSThread_Main,__newthread)
    ;
    if (iVar1 == 0) {
      *retThread = __newthread;
      retThread_local._7_1_ = '\0';
    }
    else {
      free(__newthread);
      retThread_local._7_1_ = 0x80;
    }
  }
  return retThread_local._7_1_;
}

Assistant:

UINT8 OSThread_Init(OS_THREAD** retThread, OS_THR_FUNC threadFunc, void* args)
{
	OS_THREAD* thr;
	int retVal;
	
	thr = (OS_THREAD*)calloc(1, sizeof(OS_THREAD));
	if (thr == NULL)
		return 0xFF;
	
	thr->func = threadFunc;
	thr->args = args;
	
	retVal = pthread_create(&thr->id, NULL, &OSThread_Main, thr);
	if (retVal)
	{
		free(thr);
		return 0x80;
	}
	
	*retThread = thr;
	return 0x00;
}